

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

void __thiscall
cfg::tag_tags_t<cfgfile::string_trait_t>::tag_tags_t
          (tag_tags_t<cfgfile::string_trait_t> *this,string_t *name,bool is_mandatory)

{
  child_tags_list_t *pcVar1;
  _Rb_tree_header *p_Var2;
  tag_no_value_t<cfgfile::string_trait_t> *this_00;
  values_vector_t *pvVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  string_t local_98;
  long *local_78;
  long local_70;
  long local_68 [2];
  tag_bool_scalar_t<cfgfile::string_trait_t> *local_58;
  tag_custom_t<cfgfile::string_trait_t> *local_50;
  tag_scalar_vector_t<int,_cfgfile::string_trait_t> *local_48;
  tag_no_value_t<cfgfile::string_trait_t> *local_40;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *local_38;
  
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_t_0013f718;
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.m_name.
  _M_dataplus._M_p =
       (pointer)&(this->super_tag_no_value_t<cfgfile::string_trait_t>).
                 super_tag_t<cfgfile::string_trait_t>.m_name.field_2;
  pcVar5 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->super_tag_no_value_t<cfgfile::string_trait_t>).
              super_tag_t<cfgfile::string_trait_t>.m_name,pcVar5,pcVar5 + name->_M_string_length);
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_is_mandatory = is_mandatory;
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_is_defined = false;
  pcVar1 = &(this->super_tag_no_value_t<cfgfile::string_trait_t>).
            super_tag_t<cfgfile::string_trait_t>.m_child_tags;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_child_tags.
    super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)
   &(this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_line_number = 0xffffffff;
  *(undefined4 *)
   ((long)&(this->super_tag_no_value_t<cfgfile::string_trait_t>).
           super_tag_t<cfgfile::string_trait_t>.m_line_number + 4) = 0xffffffff;
  *(undefined4 *)
   &(this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_column_number = 0xffffffff;
  *(undefined4 *)
   ((long)&(this->super_tag_no_value_t<cfgfile::string_trait_t>).
           super_tag_t<cfgfile::string_trait_t>.m_column_number + 4) = 0xffffffff;
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_tags_t_0013f860;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"string_field","");
  paVar4 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  local_38 = &this->m_string_field;
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&local_38->super_tag_t<cfgfile::string_trait_t>,(tag_t<cfgfile::string_trait_t> *)this,
             &local_98,true);
  (this->m_string_field).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_0013f8c0;
  (this->m_string_field).m_value._M_dataplus._M_p = (pointer)&(this->m_string_field).m_value.field_2
  ;
  (this->m_string_field).m_value._M_string_length = 0;
  (this->m_string_field).m_value.field_2._M_local_buf[0] = '\0';
  (this->m_string_field).m_constraint =
       (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  (this->m_string_field_constraint).
  super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_constraint_t = (_func_int **)&PTR__constraint_one_of_t_0013f920;
  p_Var2 = &(this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"no_value_field","");
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  this_00 = &this->m_no_value_field;
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&this_00->super_tag_t<cfgfile::string_trait_t>,(tag_t<cfgfile::string_trait_t> *)this,
             &local_98,true);
  (this_00->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t = (_func_int **)&PTR__tag_t_0013f6d0;
  local_40 = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"int_field","");
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  local_48 = &this->m_int_field;
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&local_48->super_tag_t<cfgfile::string_trait_t>,(tag_t<cfgfile::string_trait_t> *)this,
             &local_98,true);
  (this->m_int_field).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_vector_t_0013f970;
  pvVar3 = &(this->m_int_field).m_values;
  (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_int_field).m_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  (this->m_int_field_constraint).super_constraint_t<int>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_t_0013f9d0;
  (this->m_int_field_constraint).m_min = 0;
  (this->m_int_field_constraint).m_max = 500;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"custom_field","");
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  local_50 = &this->m_custom_field;
  tag_custom_t<cfgfile::string_trait_t>::tag_custom_t
            (local_50,(tag_t<cfgfile::string_trait_t> *)this,&local_98,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bool_scalar","");
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  local_58 = &this->m_bool_scalar;
  tag_bool_scalar_t<cfgfile::string_trait_t>::tag_bool_scalar_t
            (local_58,(tag_t<cfgfile::string_trait_t> *)this,&local_98,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"int_scalar","");
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  tag_int_scalar_t<cfgfile::string_trait_t>::tag_int_scalar_t
            (&this->m_int_scalar,(tag_t<cfgfile::string_trait_t> *)this,&local_98,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"string_scalar","");
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  tag_string_scalar_t<cfgfile::string_trait_t>::tag_string_scalar_t
            (&this->m_string_scalar,(tag_t<cfgfile::string_trait_t> *)this,&local_98,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"int_scalar_vector","");
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_70 + (long)local_78);
  tag_scalar_vector_t<cfgfile::string_trait_t>::tag_scalar_vector_t
            (&this->m_int_scalar_vector,(tag_t<cfgfile::string_trait_t> *)this,&local_98,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"one","");
  this_01 = &(this->m_string_field_constraint).m_list;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"two","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"three","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (this->m_string_field).m_constraint =
       &(this->m_string_field_constraint).
        super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  (this->m_int_field).m_constraint = &(this->m_int_field_constraint).super_constraint_t<int>;
  return;
}

Assistant:

tag_tags_t( const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_no_value_t< Trait >( name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
		,	m_no_value_field( *this, Trait::from_ascii( "no_value_field" ), true )
		,	m_int_field( *this, Trait::from_ascii( "int_field" ), true )
		,	m_int_field_constraint( 0, 500 )
		,	m_custom_field( *this, Trait::from_ascii( "custom_field" ), true )
		,	m_bool_scalar( *this, Trait::from_ascii( "bool_scalar" ), true )
		,	m_int_scalar( *this, Trait::from_ascii( "int_scalar" ), true )
		,	m_string_scalar( *this, Trait::from_ascii( "string_scalar" ), true )
		,	m_int_scalar_vector( *this, Trait::from_ascii( "int_scalar_vector" ), true )
	{
		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field.set_constraint( &m_string_field_constraint );

		m_int_field.set_constraint( &m_int_field_constraint );

	}